

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

Value * __thiscall cmake::ReportCapabilitiesJson(Value *__return_storage_ptr__,cmake *this)

{
  pointer pGVar1;
  Value *pVVar2;
  mapped_type *pmVar3;
  cmake *this_00;
  __node_base *p_Var4;
  pointer value;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generatorInfoList;
  Value generators;
  JsonValueMapType generatorMap;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  this_00 = (cmake *)0x7;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  ReportVersionJson(&local_120,this_00);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"version");
  Json::Value::operator=(pVVar2,&local_120);
  Json::Value::~Value(&local_120);
  generatorInfoList.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  generatorInfoList.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  generatorInfoList.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetRegisteredGenerators(this,&generatorInfoList,true);
  pGVar1 = generatorInfoList.
           super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  generatorMap._M_h._M_buckets = &generatorMap._M_h._M_single_bucket;
  generatorMap._M_h._M_bucket_count = 1;
  p_Var4 = &generatorMap._M_h._M_before_begin;
  generatorMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  generatorMap._M_h._M_element_count = 0;
  generatorMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  generatorMap._M_h._M_rehash_policy._M_next_resize = 0;
  generatorMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (value = generatorInfoList.
               super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
               _M_impl.super__Vector_impl_data._M_start; value != pGVar1; value = value + 1) {
    if (value->isAlias == false) {
      if ((value->extraName)._M_string_length == 0) {
        Json::Value::Value(&generators,objectValue);
        Json::Value::Value(&local_80,&value->name);
        pVVar2 = Json::Value::operator[](&generators,"name");
        Json::Value::operator=(pVVar2,&local_80);
        Json::Value::~Value(&local_80);
        Json::Value::Value(&local_a8,value->supportsToolset);
        pVVar2 = Json::Value::operator[](&generators,"toolsetSupport");
        Json::Value::operator=(pVVar2,&local_a8);
        Json::Value::~Value(&local_a8);
        Json::Value::Value(&local_d0,value->supportsPlatform);
        pVVar2 = Json::Value::operator[](&generators,"platformSupport");
        Json::Value::operator=(pVVar2,&local_d0);
        Json::Value::~Value(&local_d0);
        Json::Value::Value(&local_f8,arrayValue);
        pVVar2 = Json::Value::operator[](&generators,"extraGenerators");
        Json::Value::operator=(pVVar2,&local_f8);
        Json::Value::~Value(&local_f8);
        Json::Value::Value(&local_58,&generators);
        pmVar3 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&generatorMap,&value->name);
        Json::Value::operator=(pmVar3,&local_58);
        Json::Value::~Value(&local_58);
      }
      else {
        pmVar3 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&generatorMap,&value->baseName);
        pVVar2 = Json::Value::operator[](pmVar3,"extraGenerators");
        Json::Value::Value(&generators,&value->extraName);
        Json::Value::append(pVVar2,&generators);
      }
      Json::Value::~Value(&generators);
    }
  }
  Json::Value::Value(&generators,arrayValue);
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    Json::Value::append(&generators,(Value *)(p_Var4 + 5));
  }
  Json::Value::Value(&local_148,&generators);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"generators");
  Json::Value::operator=(pVVar2,&local_148);
  Json::Value::~Value(&local_148);
  cmFileAPI::ReportCapabilities();
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"fileApi");
  Json::Value::operator=(pVVar2,&local_170);
  Json::Value::~Value(&local_170);
  Json::Value::Value(&local_198,true);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"serverMode");
  Json::Value::operator=(pVVar2,&local_198);
  Json::Value::~Value(&local_198);
  Json::Value::~Value(&generators);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&generatorMap._M_h);
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
            (&generatorInfoList);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmake::ReportCapabilitiesJson() const
{
  Json::Value obj = Json::objectValue;

  // Version information:
  obj["version"] = this->ReportVersionJson();

  // Generators:
  std::vector<cmake::GeneratorInfo> generatorInfoList;
  this->GetRegisteredGenerators(generatorInfoList);

  JsonValueMapType generatorMap;
  for (cmake::GeneratorInfo const& gi : generatorInfoList) {
    if (gi.isAlias) { // skip aliases, they are there for compatibility reasons
                      // only
      continue;
    }

    if (gi.extraName.empty()) {
      Json::Value gen = Json::objectValue;
      gen["name"] = gi.name;
      gen["toolsetSupport"] = gi.supportsToolset;
      gen["platformSupport"] = gi.supportsPlatform;
      gen["extraGenerators"] = Json::arrayValue;
      generatorMap[gi.name] = gen;
    } else {
      Json::Value& gen = generatorMap[gi.baseName];
      gen["extraGenerators"].append(gi.extraName);
    }
  }

  Json::Value generators = Json::arrayValue;
  for (auto const& i : generatorMap) {
    generators.append(i.second);
  }
  obj["generators"] = generators;
  obj["fileApi"] = cmFileAPI::ReportCapabilities();
  obj["serverMode"] = true;

  return obj;
}